

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O3

void Rwr_CutIsBoolean_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,int fMarkA)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  do {
    lVar2 = (long)vLeaves->nSize;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if ((Abc_Obj_t *)vLeaves->pArray[lVar3] == pObj) goto LAB_004c506e;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
      lVar3 = 0;
      do {
        if (vLeaves->pArray[lVar3] == (void *)((ulong)pObj ^ 1)) {
LAB_004c506e:
          *(uint *)&pObj->field_0x14 =
               *(uint *)&pObj->field_0x14 | (uint)(fMarkA == 0) * 0x10 + 0x10;
          return;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((uVar1 == 5) || (uVar1 == 2)) {
      __assert_fail("!Abc_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                    ,0x16b,"void Rwr_CutIsBoolean_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    Rwr_CutIsBoolean_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves,fMarkA);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  } while( true );
}

Assistant:

void Rwr_CutIsBoolean_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, int fMarkA )
{
    if ( Vec_PtrFind(vLeaves, pObj) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pObj)) >= 0 )
    {
        if ( fMarkA )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
        return;
    }
    assert( !Abc_ObjIsCi(pObj) );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin0(pObj), vLeaves, fMarkA );
    Rwr_CutIsBoolean_rec( Abc_ObjFanin1(pObj), vLeaves, fMarkA );
}